

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::SendToLog(LogMessage *this)

{
  bool bVar1;
  int *piVar2;
  size_t __n;
  long in_RDI;
  CrashReason *reason;
  char *message;
  int i;
  int copy;
  char w [66];
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar3;
  LogSeverity in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  LogMessageData *in_stack_ffffffffffffff80;
  char *__buf;
  undefined4 in_stack_ffffffffffffff98;
  int iVar4;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 local_58 [4];
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  LogSeverity in_stack_ffffffffffffffc4;
  size_t in_stack_ffffffffffffffe0;
  int32 in_stack_ffffffffffffffe8;
  
  ::glog_internal_namespace_::Mutex::AssertHeld((Mutex *)log_mutex);
  if (((SendToLog::already_warned_before_initgoogle & 1U) == 0) &&
     (bVar1 = glog_internal_namespace_::IsGoogleLoggingInitialized(), !bVar1)) {
    memcpy(local_58,"WARNING: Logging before InitGoogleLogging() is written to STDERR\n",0x42);
    WriteToStderr((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                  (size_t)in_stack_ffffffffffffff68);
    SendToLog::already_warned_before_initgoogle = true;
  }
  if (((fLB::FLAGS_logtostderr & 1) == 0) &&
     (bVar1 = glog_internal_namespace_::IsGoogleLoggingInitialized(), bVar1)) {
    LogDestination::LogToAllLogfiles
              ((LogSeverity)((ulong)in_stack_ffffffffffffff80 >> 0x20),
               (time_t)in_stack_ffffffffffffff78,
               (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (size_t)in_stack_ffffffffffffff68);
    LogDestination::MaybeLogToStderr(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,0x120f6a);
    LogDestination::MaybeLogToEmail(w._52_4_,(char *)w._40_8_,w._32_8_);
    reason = (CrashReason *)
             ((*(long *)(*(long *)(in_RDI + 8) + 0x7708) - *(long *)(*(long *)(in_RDI + 8) + 0x7700)
              ) + -1);
    uVar3 = *(undefined4 *)(*(long *)(in_RDI + 8) + 0x76f8);
    LogDestination::LogToSinks
              (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,
               (tm *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  }
  else {
    ColoredWriteToStderr
              ((LogSeverity)((ulong)in_stack_ffffffffffffff80 >> 0x20),in_stack_ffffffffffffff78,
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    reason = (CrashReason *)
             ((*(long *)(*(long *)(in_RDI + 8) + 0x7708) - *(long *)(*(long *)(in_RDI + 8) + 0x7700)
              ) + -1);
    uVar3 = *(undefined4 *)(*(long *)(in_RDI + 8) + 0x76f8);
    LogDestination::LogToSinks
              (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,
               (tm *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  }
  if ((*(char *)(*(long *)(in_RDI + 8) + 0x7698) == '\x03') && ((exit_on_dfatal & 1) != 0)) {
    if ((*(byte *)(*(long *)(in_RDI + 8) + 0x7729) & 1) != 0) {
      RecordCrashReason((LogMessage *)CONCAT44(in_stack_ffffffffffffff74,uVar3),reason);
      glog_internal_namespace_::SetCrashReason((CrashReason *)0x12106a);
      piVar2 = std::min<int>((int *)&stack0xffffffffffffffa0,(int *)&stack0xffffffffffffff9c);
      iVar4 = *piVar2;
      memcpy(&fatal_message,(void *)(*(long *)(in_RDI + 8) + 4),(long)iVar4);
      (&fatal_message)[iVar4] = 0;
      fatal_time = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x76b8);
    }
    if ((fLB::FLAGS_logtostderr & 1) == 0) {
      for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
        if (*(long *)(LogDestination::log_destinations_ + (long)iVar4 * 8) != 0) {
          (**(code **)(**(long **)(*(long *)(LogDestination::log_destinations_ + (long)iVar4 * 8) +
                                  0xd8) + 0x10))
                    (*(long **)(*(long *)(LogDestination::log_destinations_ + (long)iVar4 * 8) +
                               0xd8),1,0,"",0);
        }
      }
    }
    ::glog_internal_namespace_::Mutex::Unlock((Mutex *)CONCAT44(in_stack_ffffffffffffff74,uVar3));
    LogDestination::WaitForSinks(in_stack_ffffffffffffff80);
    __buf = "*** Check failure stack trace: ***\n";
    __n = strlen("*** Check failure stack trace: ***\n");
    write(2,__buf,__n);
    Fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  static bool already_warned_before_initgoogle = false;

  log_mutex.AssertHeld();

  RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
             data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");

  // Messages of a given severity get logged to lower severity logs, too

  if (!already_warned_before_initgoogle && !IsGoogleLoggingInitialized()) {
    const char w[] = "WARNING: Logging before InitGoogleLogging() is "
                     "written to STDERR\n";
    WriteToStderr(w, strlen(w));
    already_warned_before_initgoogle = true;
  }

  // global flag: never log to file if set.  Also -- don't log to a
  // file if we haven't parsed the command line flags to get the
  // program name.
  if (FLAGS_logtostderr || !IsGoogleLoggingInitialized()) {
    ColoredWriteToStderr(data_->severity_,
                         data_->message_text_, data_->num_chars_to_log_);

    // this could be protected by a flag if necessary.
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_ -
                                data_->num_prefix_chars_ - 1),
                               data_->usecs_);
  } else {

    // log this message to all log files of severity <= severity_
    LogDestination::LogToAllLogfiles(data_->severity_, data_->timestamp_,
                                     data_->message_text_,
                                     data_->num_chars_to_log_);

    LogDestination::MaybeLogToStderr(data_->severity_, data_->message_text_,
                                     data_->num_chars_to_log_);
    LogDestination::MaybeLogToEmail(data_->severity_, data_->message_text_,
                                    data_->num_chars_to_log_);
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_
                                - data_->num_prefix_chars_ - 1),
                               data_->usecs_);
    // NOTE: -1 removes trailing \n
  }

  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->severity_ == GLOG_FATAL && exit_on_dfatal) {
    if (data_->first_fatal_) {
      // Store crash information so that it is accessible from within signal
      // handlers that may be invoked later.
      RecordCrashReason(&crash_reason);
      SetCrashReason(&crash_reason);

      // Store shortened fatal message for other logs and GWQ status
      const int copy = min<int>(data_->num_chars_to_log_,
                                sizeof(fatal_message)-1);
      memcpy(fatal_message, data_->message_text_, copy);
      fatal_message[copy] = '\0';
      fatal_time = data_->timestamp_;
    }

    if (!FLAGS_logtostderr) {
      for (int i = 0; i < NUM_SEVERITIES; ++i) {
        if ( LogDestination::log_destinations_[i] )
          LogDestination::log_destinations_[i]->logger_->Write(true, 0, "", 0);
      }
    }

    // release the lock that our caller (directly or indirectly)
    // LogMessage::~LogMessage() grabbed so that signal handlers
    // can use the logging facility. Alternately, we could add
    // an entire unsafe logging interface to bypass locking
    // for signal handlers but this seems simpler.
    log_mutex.Unlock();
    LogDestination::WaitForSinks(data_);

    const char* message = "*** Check failure stack trace: ***\n";
    if (write(STDERR_FILENO, message, strlen(message)) < 0) {
      // Ignore errors.
    }
    Fail();
  }
}